

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpServer.h
# Opt level: O2

int __thiscall TcpServer::addToWrite(TcpServer *this,int fd)

{
  bool bVar1;
  int iVar2;
  mapped_type *pmVar3;
  int iVar4;
  int local_24 [2];
  int fd_local;
  
  local_24[0] = fd;
  bVar1 = isVaildConnection(this,fd);
  iVar4 = 0;
  if (bVar1) {
    pmVar3 = std::
             map<int,_TcpConnection,_std::less<int>,_std::allocator<std::pair<const_int,_TcpConnection>_>_>
             ::operator[](&this->connections,local_24);
    *(byte *)&(pmVar3->event).events = (byte)(pmVar3->event).events | 4;
    (pmVar3->event).data.fd = local_24[0];
    iVar2 = epoll_ctl(this->epollFd,3,local_24[0],(epoll_event *)&pmVar3->event);
    if (iVar2 == -1) {
      recordError(this,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zhangke96[P]TcpServer/TcpServer/TcpServer.h"
                  ,0x19c);
      Logger::printLog(&logger,LOG_ERROR,&this->errorString,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/zhangke96[P]TcpServer/TcpServer/TcpServer.h"
                       ,0x19d);
      iVar4 = -1;
    }
  }
  return iVar4;
}

Assistant:

int addToWrite(int fd) {
    if (!isVaildConnection(fd)) {
      return 0;
    }
    auto &event = connections[fd].event;
    // printEvent(-1, event.events);
    event.events |= EPOLLOUT;
    event.data.fd = fd;
    if (epoll_ctl(epollFd, EPOLL_CTL_MOD, fd, &event) == -1) {
      recordError(__FILE__, __LINE__);
      Log(logger, Logger::LOG_ERROR, errorString);
      return -1;
    }
    return 0;
  }